

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::AdvancedNonMS<tcu::Vector<int,_4>,_5>::Run
          (AdvancedNonMS<tcu::Vector<int,_4>,_5> *this)

{
  GLuint GVar1;
  int target_00;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  undefined1 local_b8 [8];
  ivec4 res [4];
  ImageSizeMachine machine;
  GLenum GStack_28;
  int i;
  GLenum target [4];
  AdvancedNonMS<tcu::Vector<int,_4>,_5> *this_local;
  
  target._8_8_ = this;
  bVar2 = ShaderImageSizeBase::IsVSFSAvailable(&this->super_ShaderImageSizeBase,0,4);
  if (bVar2) {
    _GStack_28 = 0x806f00008c1a;
    target[0] = 0x8513;
    target[1] = 0x8c1a;
    for (machine.m_xfb_id = 0; (int)machine.m_xfb_id < 4; machine.m_xfb_id = machine.m_xfb_id + 1) {
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(&GStack_28)[(int)machine.m_xfb_id],
                 this->m_texture[(int)machine.m_xfb_id]);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(&GStack_28)[(int)machine.m_xfb_id],0x2801,0x2600);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,(&GStack_28)[(int)machine.m_xfb_id],0x2800,0x2600);
      if (machine.m_xfb_id == 0) {
        GVar4 = GStack_28;
        GVar3 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar4,2,GVar3,2,2,7);
        GVar1 = this->m_texture[0];
        GVar4 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0,GVar1,1,'\0',3,35000,GVar4);
      }
      else if (machine.m_xfb_id == 1) {
        target_00 = i;
        GVar4 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,target_00,3,GVar4,4,4,2);
        GVar1 = this->m_texture[1];
        GVar4 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,GVar1,1,'\x01',0,35000,GVar4);
      }
      else if (machine.m_xfb_id == 2) {
        GVar4 = target[0];
        GVar3 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage2D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar4,2,GVar3,2,2);
        GVar1 = this->m_texture[2];
        GVar4 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,2,GVar1,0,'\x01',0,0x88ba,GVar4);
      }
      else if (machine.m_xfb_id == 3) {
        GVar4 = target[1];
        GVar3 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glTexStorage3D
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar4,4,GVar3,0xd,7,4);
        GVar1 = this->m_texture[3];
        GVar4 = glcts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<int,4>>();
        glu::CallLogWrapper::glBindImageTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,3,GVar1,1,'\x01',0,35000,GVar4);
      }
    }
    ImageSizeMachine::ImageSizeMachine((ImageSizeMachine *)(res[3].m_data + 2));
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_b8,1,1,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[0].m_data + 2),2,2,1,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[1].m_data + 2),2,2,0,0);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[2].m_data + 2),6,3,4,0);
    this_local = (AdvancedNonMS<tcu::Vector<int,_4>,_5> *)
                 glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
                           ((ImageSizeMachine *)(res[3].m_data + 2),5,(ivec4 *)local_b8);
    ImageSizeMachine::~ImageSizeMachine((ImageSizeMachine *)(res[3].m_data + 2));
  }
  else {
    this_local = (AdvancedNonMS<tcu::Vector<int,_4>,_5> *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D_ARRAY, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 2, 2, 7);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 3, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 4, 4, 2);
				glBindImageTexture(1, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 2, TexInternalFormat<T>(), 2, 2);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 4, TexInternalFormat<T>(), 13, 7, 4);
				glBindImageTexture(3, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(1, 1, 0, 0), ivec4(2, 2, 1, 0), ivec4(2, 2, 0, 0), ivec4(6, 3, 4, 0) };
		return machine.Run<T>(STAGE, res);
	}